

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall
tonk::Connection::onResolve(Connection *this,error_code *error,results_type *results)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  error_code *in_RSI;
  long in_RDI;
  undefined1 uVar5;
  Result lookupResult;
  LogStringBuffer buffer;
  LogStringBuffer buffer_1;
  char *in_stack_fffffffffffff868;
  LogStringBuffer *in_stack_fffffffffffff870;
  atomic<bool> *in_stack_fffffffffffff878;
  ErrorType type;
  string *in_stack_fffffffffffff880;
  error_code *in_stack_fffffffffffff888;
  ErrorResult *in_stack_fffffffffffff890;
  undefined7 in_stack_fffffffffffff8a8;
  undefined1 in_stack_fffffffffffff8af;
  undefined4 in_stack_fffffffffffff8b0;
  uint in_stack_fffffffffffff8b4;
  RefCounter *in_stack_fffffffffffff8b8;
  results_type *in_stack_fffffffffffff928;
  HostnameResolverState *in_stack_fffffffffffff930;
  size_type local_6c0;
  undefined4 local_6b8;
  allocator local_6b1;
  string local_6b0 [32];
  undefined8 local_690 [3];
  string local_678 [16];
  Connection *in_stack_fffffffffffff998;
  undefined8 local_658;
  void *local_650 [2];
  error_code *local_640;
  long local_620;
  undefined4 local_614;
  string *local_610;
  char *local_608;
  undefined8 *local_600;
  undefined8 local_5e8;
  undefined4 local_5dc;
  string *local_5d8;
  char *local_5d0;
  undefined8 *local_5c8;
  void **local_5c0;
  undefined8 *local_5b8;
  void **local_5b0;
  undefined8 *local_5a8;
  void **local_5a0;
  void **local_598;
  char *local_590;
  long local_588;
  long local_580;
  char *local_578;
  ulong *local_570;
  char *local_568;
  long local_560;
  char *local_558;
  undefined4 local_54c;
  long local_548;
  undefined4 local_53c;
  long local_538;
  undefined1 local_520 [16];
  ostream aoStack_510 [376];
  char *local_398;
  undefined4 local_38c;
  long local_388;
  char *local_380;
  string *local_378;
  undefined1 *local_370;
  long local_368;
  string *local_360;
  undefined1 *local_358;
  long local_350;
  string *local_348;
  undefined1 *local_340;
  char *local_338;
  undefined1 *local_330;
  long local_328;
  char *local_320;
  undefined1 *local_318;
  char *local_310;
  ulong *local_308;
  char *local_300;
  undefined4 local_2f4;
  long local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  undefined1 local_2c8 [16];
  ostream aoStack_2b8 [376];
  char *local_140;
  ulong *local_138;
  char *local_130;
  undefined4 local_124;
  long local_120;
  char *local_118;
  ulong *local_110;
  char *local_108;
  string *local_100;
  undefined1 *local_f8;
  long local_f0;
  string *local_e8;
  undefined1 *local_e0;
  long local_d8;
  string *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  ulong *local_b8;
  char *local_b0;
  undefined1 *local_a8;
  long local_a0;
  char *local_98;
  undefined1 *local_90;
  long local_88;
  char *local_80;
  ulong *local_78;
  undefined1 *local_70;
  long local_68;
  char *local_60;
  undefined1 *local_58;
  ulong *local_50;
  undefined1 *local_48;
  long local_40;
  char *local_38;
  undefined1 *local_30;
  long local_28;
  ulong *local_20;
  undefined1 *local_18;
  char *local_10;
  undefined1 *local_8;
  
  local_580 = in_RDI + 8;
  local_640 = in_RSI;
  bVar1 = std::atomic::operator_cast_to_bool(in_stack_fffffffffffff878);
  type = (ErrorType)((ulong)in_stack_fffffffffffff878 >> 0x20);
  if (bVar1) {
    lVar4 = in_RDI + 0x110;
    local_590 = "Ignoring onResolve() result during disco";
    local_54c = 3;
    local_558 = "Ignoring onResolve() result during disco";
    local_53c = 3;
    if (*(int *)(in_RDI + 0x118) < 4) {
      local_38c = 3;
      local_398 = "Ignoring onResolve() result during disco";
      local_588 = lVar4;
      local_548 = lVar4;
      local_538 = lVar4;
      local_388 = lVar4;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffff870,in_stack_fffffffffffff868,Trace);
      local_378 = (string *)(in_RDI + 0x148);
      local_380 = local_398;
      local_370 = local_520;
      local_368 = lVar4;
      local_360 = local_378;
      local_358 = local_520;
      local_350 = lVar4;
      local_348 = local_378;
      local_340 = local_520;
      std::operator<<(aoStack_510,local_378);
      local_330 = local_370;
      local_338 = local_380;
      local_318 = local_370;
      local_320 = local_380;
      local_328 = lVar4;
      std::operator<<((ostream *)(local_370 + 0x10),local_380);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                 (LogStringBuffer *)CONCAT17(in_stack_fffffffffffff8af,in_stack_fffffffffffff8a8));
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a33ec);
    }
  }
  else {
    local_5c0 = local_650;
    local_650[0] = (void *)0x0;
    bVar1 = std::error_code::operator_cast_to_bool(local_640);
    if (bVar1) {
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffff888);
      iVar2 = std::error_code::value(local_640);
      local_620 = (long)iVar2;
      local_600 = &local_658;
      local_608 = "Connection::onResolve";
      local_610 = local_678;
      local_614 = 2;
      pvVar3 = operator_new(0x38);
      ErrorResult::ErrorResult
                (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                 in_stack_fffffffffffff880,type,(ErrorCodeT)in_stack_fffffffffffff870);
      local_5a0 = local_650;
      local_5a8 = &local_658;
      local_658 = 0;
      local_650[0] = pvVar3;
      Result::~Result((Result *)in_stack_fffffffffffff870);
      std::__cxx11::string::~string(local_678);
    }
    else {
      bVar1 = asio::ip::basic_resolver_results<asio::ip::tcp>::empty
                        ((basic_resolver_results<asio::ip::tcp> *)0x1a361b);
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_6b0,"No results",&local_6b1);
        local_5c8 = local_690;
        local_5d0 = "Connection::onResolve";
        local_5d8 = local_6b0;
        local_5dc = 0;
        local_5e8 = 3;
        pvVar3 = operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffff890,(char *)in_stack_fffffffffffff888,
                   in_stack_fffffffffffff880,type,(ErrorCodeT)in_stack_fffffffffffff870);
        local_5b0 = local_650;
        local_5b8 = local_690;
        local_690[0] = 0;
        local_650[0] = pvVar3;
        Result::~Result((Result *)in_stack_fffffffffffff870);
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
      }
    }
    local_598 = local_650;
    uVar5 = local_650[0] != (void *)0x0;
    if ((bool)uVar5) {
      RefCounter::StartShutdown
                (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b4,
                 (Result *)CONCAT17(uVar5,in_stack_fffffffffffff8a8));
      local_6b8 = 1;
    }
    else {
      lVar4 = in_RDI + 0x110;
      local_6c0 = asio::ip::basic_resolver_results<asio::ip::tcp>::size
                            ((basic_resolver_results<asio::ip::tcp> *)0x1a3873);
      local_568 = "Resolve success: ";
      local_570 = &local_6c0;
      local_578 = " results";
      local_2f4 = 1;
      local_300 = "Resolve success: ";
      local_310 = " results";
      local_2e4 = 1;
      local_560 = lVar4;
      local_308 = local_570;
      local_2f0 = lVar4;
      local_2e0 = lVar4;
      if (*(int *)(in_RDI + 0x118) < 2) {
        local_124 = 1;
        local_130 = "Resolve success: ";
        local_140 = " results";
        local_138 = local_570;
        local_120 = lVar4;
        logger::LogStringBuffer::LogStringBuffer
                  (in_stack_fffffffffffff870,in_stack_fffffffffffff868,Trace);
        local_100 = (string *)(lVar4 + 0x38);
        local_f8 = local_2c8;
        local_108 = local_130;
        local_110 = local_138;
        local_118 = local_140;
        local_f0 = lVar4;
        local_e8 = local_100;
        local_e0 = local_f8;
        local_d8 = lVar4;
        local_d0 = local_100;
        local_c8 = local_f8;
        std::operator<<(aoStack_2b8,local_100);
        local_a8 = local_f8;
        local_b0 = local_108;
        local_b8 = local_110;
        local_c0 = local_118;
        local_90 = local_f8;
        local_98 = local_108;
        local_58 = local_f8;
        local_60 = local_108;
        local_a0 = lVar4;
        local_88 = lVar4;
        std::operator<<((ostream *)(local_f8 + 0x10),local_108);
        local_70 = local_a8;
        local_78 = local_b8;
        local_80 = local_c0;
        local_48 = local_a8;
        local_50 = local_b8;
        local_18 = local_a8;
        local_20 = local_b8;
        local_68 = lVar4;
        local_40 = lVar4;
        std::ostream::operator<<((ostream *)(local_a8 + 0x10),*local_b8);
        local_30 = local_70;
        local_38 = local_80;
        local_8 = local_70;
        local_10 = local_80;
        local_28 = lVar4;
        std::operator<<((ostream *)(local_70 + 0x10),local_80);
        in_stack_fffffffffffff870 = (LogStringBuffer *)logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write
                  ((OutputWorker *)CONCAT44(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0),
                   (LogStringBuffer *)CONCAT17(uVar5,in_stack_fffffffffffff8a8));
        logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1a3cce);
      }
      std::
      unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>::
      operator->((unique_ptr<tonk::HostnameResolverState,_std::default_delete<tonk::HostnameResolverState>_>
                  *)0x1a3ce8);
      HostnameResolverState::InitializeResolvedAddressList
                (in_stack_fffffffffffff930,in_stack_fffffffffffff928);
      startConnectingToNextAddress(in_stack_fffffffffffff998);
      local_6b8 = 0;
    }
    Result::~Result((Result *)in_stack_fffffffffffff870);
  }
  return;
}

Assistant:

void Connection::onResolve(const asio::error_code& error, const asio::ip::tcp::resolver::results_type& results)
{
    if (SelfRefCount.IsShutdown()) {
        Logger.Warning("Ignoring onResolve() result during disco");
        return;
    }

    Result lookupResult;
    if (error) {
        lookupResult = Result("Connection::onResolve", error.message(), ErrorType::Asio, error.value());
    }
    else if (results.empty()) {
        lookupResult = Result("Connection::onResolve", "No results", ErrorType::Tonk, Tonk_HostnameLookup);
    }

    if (lookupResult.IsFail()) {
        SelfRefCount.StartShutdown(Tonk_HostnameLookup, lookupResult);
        return;
    }

    Logger.Debug("Resolve success: ", results.size(), " results");

    ResolverState->InitializeResolvedAddressList(results);

    // Post a connect to this address
    startConnectingToNextAddress();
}